

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

bool Js::TypedArrayCompareElementsHelper<char16_t>(CompareVarsInfo *cvInfo,void *elem1,void *elem2)

{
  ushort uVar1;
  ushort uVar2;
  RecyclableObject *this;
  code *pcVar3;
  bool bVar4;
  int32 iVar5;
  undefined4 *puVar6;
  RecyclableObject **ppRVar7;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  RecyclableObject *pRVar8;
  ThreadContext *pTVar9;
  JavascriptMethod p_Var10;
  Var pvVar11;
  Var pvVar12;
  double dVar13;
  CallInfo local_8c;
  CallInfo local_84 [2];
  undefined1 local_70 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Var retVal;
  Var undefined;
  ScriptContext *scriptContext;
  RecyclableObject *compFn;
  char16_t y;
  char16_t x;
  char16_t *element2;
  char16_t *element1;
  void *elem2_local;
  void *elem1_local;
  CompareVarsInfo *cvInfo_local;
  
  if (elem1 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x865,"(element1 != nullptr)","element1 != nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (elem2 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x866,"(element2 != nullptr)","element2 != nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (cvInfo == (CompareVarsInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x867,"(cvInfo != nullptr)","cvInfo != nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar1 = *elem1;
  uVar2 = *elem2;
  bVar4 = NumberUtilities::IsNan((double)uVar1);
  if (bVar4) {
    cvInfo_local._7_1_ = false;
  }
  else {
    bVar4 = NumberUtilities::IsNan((double)uVar2);
    if (bVar4) {
      cvInfo_local._7_1_ = true;
    }
    else {
      ppRVar7 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                          ((WriteBarrierPtr *)&cvInfo->compFn);
      if (*ppRVar7 == (RecyclableObject *)0x0) {
        cvInfo_local._7_1_ = uVar1 < uVar2;
      }
      else {
        ppRVar7 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                            ((WriteBarrierPtr *)&cvInfo->compFn);
        this = *ppRVar7;
        this_00 = RecyclableObject::GetScriptContext(this);
        this_01 = ScriptContext::GetLibrary(this_00);
        pRVar8 = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
        autoReentrancyHandler.m_savedReentrancySafeOrHandled = false;
        autoReentrancyHandler._9_7_ = 0;
        pTVar9 = ScriptContext::GetThreadContext(this_00);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_70,pTVar9);
        pTVar9 = ScriptContext::GetThreadContext(this_00);
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar9);
        pTVar9 = ScriptContext::GetThreadContext(this_00);
        ThreadContext::AssertJsReentrancy(pTVar9);
        p_Var10 = RecyclableObject::GetEntryPoint(this);
        CheckIsExecutable(this,p_Var10);
        p_Var10 = RecyclableObject::GetEntryPoint(this);
        CallInfo::CallInfo(local_84,CallFlags_Value,3);
        CallInfo::CallInfo(&local_8c,CallFlags_Value,3);
        pvVar11 = JavascriptNumber::ToVarNoCheck((double)uVar1,this_00);
        pvVar12 = JavascriptNumber::ToVarNoCheck((double)uVar2,this_00);
        autoReentrancyHandler._8_8_ =
             (*p_Var10)(this,(CallInfo)this,local_84[0],0,0,0,0,local_8c,pRVar8,pvVar11,pvVar12);
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_70);
        bVar4 = TaggedInt::Is((Var)autoReentrancyHandler._8_8_);
        if (bVar4) {
          iVar5 = TaggedInt::ToInt32((Var)autoReentrancyHandler._8_8_);
          cvInfo_local._7_1_ = iVar5 < 0;
        }
        else {
          bVar4 = JavascriptNumber::Is_NoTaggedIntCheck((Var)autoReentrancyHandler._8_8_);
          if (bVar4) {
            dVar13 = JavascriptNumber::GetValue((Var)autoReentrancyHandler._8_8_);
            cvInfo_local._7_1_ = dVar13 < 0.0;
          }
          else {
            dVar13 = JavascriptConversion::ToNumber_Full((Var)autoReentrancyHandler._8_8_,this_00);
            cvInfo_local._7_1_ = dVar13 < 0.0;
          }
        }
      }
    }
  }
  return cvInfo_local._7_1_;
}

Assistant:

bool TypedArrayCompareElementsHelper(JavascriptArray::CompareVarsInfo* cvInfo, const void* elem1, const void* elem2)
    {
        const T* element1 = static_cast<const T*>(elem1);
        const T* element2 = static_cast<const T*>(elem2);

        Assert(element1 != nullptr);
        Assert(element2 != nullptr);
        Assert(cvInfo != nullptr);

        const T x = *element1;
        const T y = *element2;

        // ECMA2023 spec requires that NaN values are sorted to the end
        if (NumberUtilities::IsNan((double)x))
        {
            return false;
        }
        else if (NumberUtilities::IsNan((double)y))
        {
            return true;
        }

        if (cvInfo->compFn != nullptr)
        {
            RecyclableObject* compFn = cvInfo->compFn;
            ScriptContext* scriptContext = compFn->GetScriptContext();
            Var undefined = scriptContext->GetLibrary()->GetUndefined();
            Var retVal = nullptr;
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                retVal = CALL_FUNCTION(scriptContext->GetThreadContext(),
                            compFn, CallInfo(CallFlags_Value, 3),
                            undefined,
                            JavascriptNumber::ToVarNoCheck((double)x, scriptContext),
                            JavascriptNumber::ToVarNoCheck((double)y, scriptContext));
            }
            END_SAFE_REENTRANT_CALL

            if (TaggedInt::Is(retVal))
            {
                return TaggedInt::ToInt32(retVal) < 0;
            }

            if (JavascriptNumber::Is_NoTaggedIntCheck(retVal))
            {
                return JavascriptNumber::GetValue(retVal) < 0;
            }

            return JavascriptConversion::ToNumber_Full(retVal, scriptContext) < 0;
        }
        else // simple comparison when no user method provided
        {
            return x < y;
        }
    }